

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void __thiscall
cmdline::parser::add<unsigned_long,cmdline::default_reader<unsigned_long>>
          (parser *this,key_type *name,char short_name,undefined8 desc,byte need,undefined8 def)

{
  size_type sVar1;
  cmdline_error *this_00;
  option_with_value_with_reader<unsigned_long,_cmdline::default_reader<unsigned_long>_> *poVar2;
  mapped_type *ppoVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 local_40;
  unsigned_long def_local;
  undefined8 uStack_30;
  bool need_local;
  string *desc_local;
  key_type *pkStack_20;
  char short_name_local;
  string *name_local;
  parser *this_local;
  
  def_local._7_1_ = need & 1;
  local_40 = def;
  uStack_30 = desc;
  desc_local._7_1_ = short_name;
  pkStack_20 = name;
  name_local = (string *)this;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar1 != 0) {
    this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_60,"multiple definition: ",pkStack_20);
    cmdline_error::cmdline_error(this_00,&local_60);
    __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  poVar2 = (option_with_value_with_reader<unsigned_long,_cmdline::default_reader<unsigned_long>_> *)
           operator_new(0x70);
  option_with_value_with_reader<unsigned_long,_cmdline::default_reader<unsigned_long>_>::
  option_with_value_with_reader
            (poVar2,pkStack_20,(int)desc_local._7_1_,def_local._7_1_ & 1,local_40,uStack_30);
  ppoVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,pkStack_20);
  *ppoVar3 = (mapped_type)poVar2;
  ppoVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,pkStack_20);
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back(&this->ordered,ppoVar3);
  return;
}

Assistant:

void add(const std::string &name, char short_name = 0, const std::string &desc = "", bool need = true, const T def = T(), F reader = F())
		{
			if(options.count(name))
				throw cmdline_error("multiple definition: " + name);
			options[name] = new option_with_value_with_reader<T, F>(name, short_name, need, def, desc, reader);
			ordered.push_back(options[name]);
		}